

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  undefined1 auVar1 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int64_t j;
  int64_t i;
  long local_28;
  long local_20;
  
  if (in_RSI[1] != *in_RDI) {
    __assert_fail("A.m_ == m_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x43,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
  }
  if (in_RSI[2] == *in_RDX) {
    for (local_20 = 0; local_20 < *in_RDI; local_20 = local_20 + 1) {
      *(undefined4 *)(in_RDI[1] + local_20 * 4) = 0;
      for (local_28 = 0; local_28 < in_RSI[2]; local_28 = local_28 + 1) {
        auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDX[1] + local_28 * 4)),
                                 ZEXT416(*(uint *)(*in_RSI + (local_20 * in_RSI[2] + local_28) * 4))
                                 ,ZEXT416(*(uint *)(in_RDI[1] + local_20 * 4)));
        *(int *)(in_RDI[1] + local_20 * 4) = auVar1._0_4_;
      }
    }
    return;
  }
  __assert_fail("A.n_ == vec.m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                ,0x44,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.m_ == m_);
  assert(A.n_ == vec.m_);
  for (int64_t i = 0; i < m_; i++) {
    data_[i] = 0.0;
    for (int64_t j = 0; j < A.n_; j++) {
      data_[i] += A.data_[i * A.n_ + j] * vec.data_[j];
    }
  }
}